

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_state_upgrade_tls(connectdata *conn)

{
  CURLcode CVar1;
  
  if ((conn->proto).imapc.ssldone == true) {
    CVar1 = imap_state_login(conn);
    (conn->proto).imapc.state = IMAP_STOP;
    return CVar1;
  }
  return CURLE_NOT_BUILT_IN;
}

Assistant:

static CURLcode imap_state_upgrade_tls(struct connectdata *conn)
{
  struct imap_conn *imapc = &conn->proto.imapc;
  CURLcode result;

  result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &imapc->ssldone);

  if(imapc->ssldone) {
    imap_to_imaps(conn);
    result = imap_state_login(conn);
    state(conn, IMAP_STOP);
  }

  return result;
}